

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void __thiscall pixels::fillPattern2(pixels *this)

{
  uint16_t uVar1;
  value_type vVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  int *in_RDI;
  int c;
  size_t idx;
  int x;
  int y;
  double in_stack_ffffffffffffff98;
  float f;
  undefined2 in_stack_ffffffffffffffa0;
  uint16_t in_stack_ffffffffffffffa2;
  half local_22;
  int local_20;
  half local_1c;
  half local_1a;
  size_type local_18;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < in_RDI[1]; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < *in_RDI; local_10 = local_10 + 1) {
      local_18 = (size_type)(local_c * in_RDI[2] + local_10);
      vVar2 = local_10 % 100 + (local_c % 100) * 100;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4),
                          local_18);
      *pvVar3 = vVar2;
      sin((double)local_c);
      sin((double)local_10 * 0.5);
      f = (float)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      Imath_3_2::half::half
                ((half *)CONCAT44(vVar2,CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0
                                                )),f);
      uVar1 = Imath_3_2::half::bits(&local_1a);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 10),local_18);
      *pvVar4 = (float)uVar1;
      sin((double)local_10);
      sin((double)local_c * 0.5);
      Imath_3_2::half::half
                ((half *)CONCAT44(vVar2,CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0
                                                )),f);
      uVar1 = Imath_3_2::half::bits(&local_1c);
      pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x10)
                          ,local_18);
      *pvVar5 = uVar1;
      for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
        in_stack_ffffffffffffff98 = sin((double)(local_10 + local_20));
        sin((double)local_c * 0.5);
        Imath_3_2::half::half
                  ((half *)CONCAT44(vVar2,CONCAT22(in_stack_ffffffffffffffa2,
                                                   in_stack_ffffffffffffffa0)),
                   (float)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        in_stack_ffffffffffffffa2 = Imath_3_2::half::bits(&local_22);
        pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                            (in_RDI + (long)local_20 * 6 + 0x16),local_18);
        *pvVar5 = in_stack_ffffffffffffffa2;
      }
    }
  }
  return;
}

Assistant:

void fillPattern2 ()
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;
                i[idx]     = x % 100 + 100 * (y % 100);
                f[idx] =
                    half (sin (double (y)) + sin (double (x) * 0.5)).bits ();
                h[idx] =
                    half (sin (double (x)) + sin (double (y) * 0.5)).bits ();
                for (int c = 0; c < 4; ++c)
                    rgba[c][idx] =
                        half (sin (double (x + c)) + sin (double (y) * 0.5))
                            .bits ();
            }
        }
    }